

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

void stream_cork(cubeb_stream_conflict *stm,cork_state state)

{
  (*cubeb_pa_threaded_mainloop_lock)(stm->context->mainloop);
  cork_io_stream(stm,stm->output_stream,state);
  cork_io_stream(stm,stm->input_stream,state);
  (*cubeb_pa_threaded_mainloop_unlock)(stm->context->mainloop);
  if ((state & NOTIFY) == UNCORK) {
    return;
  }
  stm->state = state & CORK;
  (*stm->state_callback)(stm,stm->user_ptr,state & CORK);
  return;
}

Assistant:

static void
stream_cork(cubeb_stream * stm, enum cork_state state)
{
  WRAP(pa_threaded_mainloop_lock)(stm->context->mainloop);
  cork_io_stream(stm, stm->output_stream, state);
  cork_io_stream(stm, stm->input_stream, state);
  WRAP(pa_threaded_mainloop_unlock)(stm->context->mainloop);

  if (state & NOTIFY) {
    stream_state_change_callback(stm, state & CORK ? CUBEB_STATE_STOPPED
                                                   : CUBEB_STATE_STARTED);
  }
}